

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler_unittest.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_39d8::ProfileHandlerTest::StopWorker(ProfileHandlerTest *this)

{
  mutex *__mutex;
  BusyThread *pBVar1;
  int iVar2;
  
  pBVar1 = this->busy_worker_;
  __mutex = &pBVar1->mu_;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  pBVar1->stop_work_ = true;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  pthread_join((this->busy_worker_->super_Thread).thread_,(void **)0x0);
  if (this->busy_worker_ != (BusyThread *)0x0) {
    (*(this->busy_worker_->super_Thread)._vptr_Thread[1])();
    return;
  }
  return;
}

Assistant:

void StopWorker() {
    busy_worker_->set_stop_work(true);
    busy_worker_->Join();
    delete busy_worker_;
  }